

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::runtime::basic_param>::
shared_ptr<boost::runtime::parameter<unsigned_long,(boost::runtime::args_amount)0,false>>
          (shared_ptr<boost::runtime::basic_param> *this,
          parameter<unsigned_long,_(boost::runtime::args_amount)0,_false> *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  parameter<unsigned_long,_(boost::runtime::args_amount)0,_false> *p_00;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (parameter<unsigned_long,_(boost::runtime::args_amount)0,_false> *)(in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::
  sp_pointer_construct<boost::runtime::basic_param,boost::runtime::parameter<unsigned_long,(boost::runtime::args_amount)0,false>>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }